

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * cmdline::detail::demangle(string *__return_storage_ptr__,string *name)

{
  undefined8 uVar1;
  char *pcVar2;
  allocator local_2a;
  undefined1 local_29;
  char *local_28;
  char *p;
  string *psStack_18;
  int status;
  string *name_local;
  string *ret;
  
  p._4_4_ = 0;
  psStack_18 = name;
  name_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = (char *)__cxa_demangle(uVar1,0,0,(long)&p + 4);
  local_29 = 0;
  local_28 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  free(local_28);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string demangle(const std::string
            &name)
            {
                int status = 0;
                char *p = abi::__cxa_demangle(name.c_str(), 0, 0, &status);
                std::string ret(p);
                free(p);
                return ret;
            }